

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  FieldDescriptor *pFVar4;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var5;
  int iVar6;
  JavaType JVar7;
  OneofGeneratorInfo *args_1;
  LogMessage *pLVar8;
  long *plVar9;
  FieldDescriptor **ppFVar10;
  Descriptor *pDVar11;
  ImmutableMessageLiteGenerator *extraout_RDX;
  ImmutableMessageLiteGenerator *extraout_RDX_00;
  ImmutableMessageLiteGenerator *extraout_RDX_01;
  ImmutableMessageLiteGenerator *extraout_RDX_02;
  ImmutableMessageLiteGenerator *pIVar12;
  long lVar13;
  ulong uVar14;
  uint32 uVar15;
  uint32 uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  bool bVar20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string line;
  LogFinisher local_f1;
  Printer *local_f0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_e8;
  string local_c8;
  undefined1 local_a0 [56];
  LogMessage local_68;
  
  io::Printer::Indent(printer);
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar11 = (this->super_MessageGenerator).descriptor_;
  bVar20 = *(int *)(*(long *)(pDVar11 + 0x10) + 0x3c) != 3;
  uVar15 = bVar20 + 2;
  if (*(char *)(*(long *)(pDVar11 + 0x20) + 0x48) == '\0') {
    uVar15 = (uint32)bVar20;
  }
  WriteUInt32ToUtf16CharSequence(uVar15,&local_e8);
  WriteUInt32ToUtf16CharSequence
            (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&local_e8);
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x6c),&local_e8);
    pDVar11 = (this->super_MessageGenerator).descriptor_;
    pIVar12 = extraout_RDX;
    local_f0 = printer;
    if (0 < *(int *)(pDVar11 + 0x6c)) {
      lVar13 = 0;
      lVar17 = 0;
      do {
        args_1 = Context::GetOneofGeneratorInfo
                           (this->context_,(OneofDescriptor *)(*(long *)(pDVar11 + 0x30) + lVar13));
        io::Printer::Print<char[11],std::__cxx11::string>
                  (local_f0,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3a8c60,
                   &args_1->name);
        lVar17 = lVar17 + 1;
        pDVar11 = (this->super_MessageGenerator).descriptor_;
        lVar13 = lVar13 + 0x30;
        pIVar12 = extraout_RDX_00;
      } while (lVar17 < *(int *)(pDVar11 + 0x6c));
    }
    pDVar11 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar11 + 0x68) < 1) {
      iVar18 = 0;
    }
    else {
      lVar17 = 0;
      lVar13 = 0;
      iVar18 = 0;
      do {
        lVar2 = *(long *)(pDVar11 + 0x28);
        if (*(Descriptor **)(lVar2 + 0x50 + lVar17) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x87);
          pLVar8 = internal::LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar8);
          internal::LogMessage::~LogMessage(&local_68);
        }
        if (*(char *)(lVar2 + 0x42 + lVar17) == '\0') {
          plVar9 = (long *)(*(long *)(lVar2 + 0x50 + lVar17) + 0x28);
        }
        else {
          lVar3 = *(long *)(lVar2 + 0x60 + lVar17);
          if (lVar3 == 0) {
            plVar9 = (long *)(*(long *)(lVar2 + 0x28 + lVar17) + 0x80);
          }
          else {
            plVar9 = (long *)(lVar3 + 0x50);
          }
        }
        iVar6 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(int)((ulong)((lVar2 - *plVar9) + lVar17) >> 3) * 0x286bca1b]
                                      ._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                                      ._M_t + 0x10))();
        iVar18 = iVar18 + iVar6;
        lVar13 = lVar13 + 1;
        pDVar11 = (this->super_MessageGenerator).descriptor_;
        lVar17 = lVar17 + 0x98;
        pIVar12 = this;
      } while (lVar13 < *(int *)(pDVar11 + 0x68));
    }
    iVar6 = iVar18 + 0x3e;
    if (-1 < iVar18 + 0x1f) {
      iVar6 = iVar18 + 0x1f;
    }
    uVar15 = iVar6 >> 5;
    if (0 < iVar18) {
      uVar16 = 1;
      if (1 < (int)uVar15) {
        uVar16 = uVar15;
      }
      uVar19 = 0;
      do {
        GetBitFieldName_abi_cxx11_((string *)local_a0,(java *)(ulong)uVar19,(int)pIVar12);
        io::Printer::Print<char[15],std::__cxx11::string>
                  (local_f0,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",
                   (string *)local_a0);
        pIVar12 = extraout_RDX_01;
        if ((FieldDescriptor *)local_a0._0_8_ != (FieldDescriptor *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
          pIVar12 = extraout_RDX_02;
        }
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_e8);
    ppFVar10 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) < 1) {
      uVar16 = 0;
      uVar15 = 0;
    }
    else {
      lVar13 = 0;
      uVar15 = 0;
      uVar16 = 0;
      do {
        pFVar4 = ppFVar10[lVar13];
        if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
          local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_c8._M_dataplus._M_p = (pointer)pFVar4;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_a0,
                     (FieldDescriptor **)&local_c8);
        }
        if ((*(int *)(pFVar4 + 0x38) == 0xb) &&
           (bVar20 = FieldDescriptor::is_map_message_type(pFVar4), bVar20)) {
          uVar16 = uVar16 + 1;
        }
        else {
          uVar15 = uVar15 + (*(int *)(pFVar4 + 0x3c) == 3);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68));
    }
    WriteUInt32ToUtf16CharSequence(*(uint32 *)(*ppFVar10 + 0x44),&local_e8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)
                (ppFVar10[(long)*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) + -1] +
                0x44),&local_e8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32 *)((this->super_MessageGenerator).descriptor_ + 0x68),&local_e8);
    WriteUInt32ToUtf16CharSequence(uVar16,&local_e8);
    WriteUInt32ToUtf16CharSequence(uVar15,&local_e8);
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    pDVar11 = (this->super_MessageGenerator).descriptor_;
    if (0 < *(int *)(pDVar11 + 0x68)) {
      lVar13 = 0;
      lVar17 = 0;
      do {
        if (*(int *)(*(long *)(pDVar11 + 0x28) + 0x3c + lVar13) == 2) {
LAB_002b6102:
          local_a0._0_8_ = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar13;
          if (local_c8._M_string_length == local_c8.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_c8,(iterator)local_c8._M_string_length,(FieldDescriptor **)local_a0
                      );
          }
          else {
            *(undefined8 *)local_c8._M_string_length = local_a0._0_8_;
            local_c8._M_string_length = local_c8._M_string_length + 8;
          }
        }
        else {
          JVar7 = GetJavaType((FieldDescriptor *)(*(long *)(pDVar11 + 0x28) + lVar13));
          if (JVar7 == JAVATYPE_MESSAGE) {
            pDVar11 = FieldDescriptor::message_type
                                ((FieldDescriptor *)
                                 (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                 lVar13));
            bVar20 = HasRequiredFields(pDVar11);
            if (bVar20) goto LAB_002b6102;
          }
        }
        lVar17 = lVar17 + 1;
        pDVar11 = (this->super_MessageGenerator).descriptor_;
        lVar13 = lVar13 + 0x98;
      } while (lVar17 < *(int *)(pDVar11 + 0x68));
    }
    WriteUInt32ToUtf16CharSequence
              ((uint32)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p >> 3),&local_e8)
    ;
    if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68)) {
      lVar13 = 0;
      do {
        pFVar4 = ppFVar10[lVar13];
        if (*(Descriptor **)(pFVar4 + 0x50) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x87);
          pLVar8 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=(&local_f1,pLVar8);
          internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        if (pFVar4[0x42] == (FieldDescriptor)0x0) {
          plVar9 = (long *)(*(long *)(pFVar4 + 0x50) + 0x28);
        }
        else if (*(long *)(pFVar4 + 0x60) == 0) {
          plVar9 = (long *)(*(long *)(pFVar4 + 0x28) + 0x80);
        }
        else {
          plVar9 = (long *)(*(long *)(pFVar4 + 0x60) + 0x50);
        }
        _Var5._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
        .
        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
        ._M_head_impl =
             (this->field_generators_).field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)((long)pFVar4 - *plVar9) >> 3) * 0x286bca1b]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
             ._M_t;
        (**(code **)(*(long *)_Var5._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                              ._M_head_impl + 0x38))
                  (_Var5._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                   ._M_head_impl,local_f0,&local_e8);
        lVar13 = lVar13 + 1;
      } while (lVar13 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x68));
    }
    io::Printer::Outdent(local_f0);
    io::Printer::Print<>(local_f0,"};\n");
    if ((FieldDescriptor *)local_c8._M_dataplus._M_p != (FieldDescriptor *)0x0) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    operator_delete__(ppFVar10);
    printer = local_f0;
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  paVar1 = &local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity =
       local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  if (local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      EscapeUtf16ToString(local_e8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14],&local_c8);
      if (0x4f < local_c8._M_string_length) {
        io::Printer::Print<char[7],std::__cxx11::string>
                  (printer,"    \"$string$\" +\n",(char (*) [7])0x3e5d9b,&local_c8);
        local_c8._M_string_length = 0;
        *local_c8._M_dataplus._M_p = '\0';
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)local_e8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"    \"$string$\";\n",(char (*) [7])0x3e5d9b,&local_c8);
  io::Printer::Print<>(printer,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(printer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16> chars;

  int flags = 0;
  if (SupportFieldPresence(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(descriptor_->oneof_decl_count(), &chars);
    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16 code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}